

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall capnp::anon_unknown_79::Input::consume(Input *this,ArrayPtr<const_char> expected)

{
  bool bVar1;
  Fault f_1;
  ArrayPtr<const_char> prefix;
  Fault local_30;
  ArrayPtr<const_char> local_28;
  ArrayPtr<const_char> local_18;
  
  local_28.size_ = expected.size_;
  local_28.ptr = expected.ptr;
  if ((this->wrapped).size_ < local_28.size_) {
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x238,FAILED,"wrapped.size() >= expected.size()","");
    kj::_::Debug::Fault::fatal((Fault *)&local_18);
  }
  local_18.ptr = (this->wrapped).ptr;
  local_18.size_ = local_28.size_;
  bVar1 = kj::ArrayPtr<const_char>::operator==(&local_18,&local_28);
  if (bVar1) {
    advance(this,local_28.size_);
    return;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[34]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x23b,FAILED,"prefix == expected","\"Unexpected input in JSON message.\"",
             (char (*) [34])"Unexpected input in JSON message.");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

void consume(kj::ArrayPtr<const char> expected) {
    KJ_REQUIRE(wrapped.size() >= expected.size());

    auto prefix = wrapped.slice(0, expected.size());
    KJ_REQUIRE(prefix == expected, "Unexpected input in JSON message.");

    advance(expected.size());
  }